

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,char_const(&)[10],kj::StringPtr_const&,unsigned_long_const&,char_const(&)[21]>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          char (*params) [10],StringPtr *params_1,unsigned_long *params_2,char (*params_3) [21])

{
  undefined4 in_register_00000014;
  StringPtr *params_00;
  unsigned_long *params_01;
  char (*params_02) [21];
  ArrayDisposer **local_100;
  undefined1 local_98 [8];
  String argValues [4];
  char *macroArgs_local;
  char *condition_local;
  Type code_local;
  int line_local;
  char *file_local;
  Fault *this_local;
  
  this->exception = (Exception *)0x0;
  str<char_const(&)[10]>
            ((String *)local_98,(kj *)params,(char (*) [10])CONCAT44(in_register_00000014,line));
  str<kj::StringPtr_const&>((String *)&argValues[0].content.disposer,(kj *)params_1,params_00);
  str<unsigned_long_const&>((String *)&argValues[1].content.disposer,(kj *)params_2,params_01);
  str<char_const(&)[21]>((String *)&argValues[2].content.disposer,(kj *)params_3,params_02);
  arrayPtr<kj::String>((String *)local_98,4);
  init(this,(EVP_PKEY_CTX *)file);
  local_100 = &argValues[3].content.disposer;
  do {
    local_100 = local_100 + -3;
    String::~String((String *)local_100);
  } while (local_100 != (ArrayDisposer **)local_98);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}